

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilProgress.c
# Opt level: O2

void Extra_ProgressBarShow(ProgressBar *p,char *pString)

{
  int iVar1;
  size_t sVar2;
  int iVar3;
  
  if (p != (ProgressBar *)0x0) {
    iVar3 = 0;
    iVar1 = Abc_FrameIsBatchMode();
    if (iVar1 == 0) {
      if (pString != (char *)0x0) {
        fprintf((FILE *)p->pFile,"%s ",pString);
        sVar2 = strlen(pString);
        iVar3 = (int)sVar2 + 1;
      }
      for (; iVar3 < p->posCur; iVar3 = iVar3 + 1) {
        fputc(0x2d,(FILE *)p->pFile);
      }
      if (iVar3 == p->posCur) {
        fputc(0x3e,(FILE *)p->pFile);
      }
      for (; iVar3 < p->posTotal; iVar3 = iVar3 + 1) {
        fputc(0x20,(FILE *)p->pFile);
      }
      fputc(0xd,(FILE *)p->pFile);
      fflush(_stdout);
      return;
    }
  }
  return;
}

Assistant:

void Extra_ProgressBarShow( ProgressBar * p, char * pString )
{
    int i;
    if ( p == NULL ) 
        return;
    if ( Abc_FrameIsBatchMode() )
        return;
    if ( pString )
        fprintf( p->pFile, "%s ", pString );
    for ( i = (pString? strlen(pString) + 1 : 0); i < p->posCur; i++ )
        fprintf( p->pFile, "-" );
    if ( i == p->posCur )
        fprintf( p->pFile, ">" );
    for ( i++  ; i <= p->posTotal; i++ )
        fprintf( p->pFile, " " );
    fprintf( p->pFile, "\r" );
    fflush( stdout );
}